

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSGetterName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field,BytesMode bytes_mode,bool drop_list)

{
  bool bVar1;
  Type TVar2;
  BytesMode bytes_mode_00;
  string suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  JSIdent_abi_cxx11_(__return_storage_ptr__,this,(GeneratorOptions *)0x1,field,SUB41(bytes_mode,0),
                     drop_list,suffix._M_dataplus._M_p._0_1_);
  TVar2 = FieldDescriptor::type((FieldDescriptor *)this);
  if (TVar2 == TYPE_BYTES) {
    JSByteGetterSuffix_abi_cxx11_
              (&suffix,(_anonymous_namespace_ *)((ulong)options & 0xffffffff),bytes_mode_00);
    if (suffix._M_string_length != 0) {
      std::operator+(&local_38,"_as",&suffix);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_38);
    }
    std::__cxx11::string::~string((string *)&suffix);
  }
  bVar1 = std::operator==(__return_storage_ptr__,"Extension");
  if ((!bVar1) && (bVar1 = std::operator==(__return_storage_ptr__,"JsPbMessageId"), !bVar1)) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string JSGetterName(const GeneratorOptions& options,
                         const FieldDescriptor* field,
                         BytesMode bytes_mode = BYTES_DEFAULT,
                         bool drop_list = false) {
  std::string name = JSIdent(options, field,
                             /* is_upper_camel = */ true,
                             /* is_map = */ false, drop_list);
  if (field->type() == FieldDescriptor::TYPE_BYTES) {
    std::string suffix = JSByteGetterSuffix(bytes_mode);
    if (!suffix.empty()) {
      name += "_as" + suffix;
    }
  }
  if (name == "Extension" || name == "JsPbMessageId") {
    // Avoid conflicts with base-class names.
    name += "$";
  }
  return name;
}